

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::InterpolateOrientation(ChElementShellReissner4 *this)

{
  ChVector<double> *this_00;
  ChMatrix33<double> *pCVar1;
  ChMatrix33<double> *xi;
  ChMatrix33<double> *v;
  ChMatrix33<double> *pCVar2;
  ChMatrix33<double> *extraout_RDX;
  ChMatrix33<double> (*paCVar3) [4];
  ChVector<double> *pCVar4;
  long lVar5;
  int i;
  long lVar6;
  ChVector<double> phi_tilde_0;
  ChMatrix33<double> T_overline_Gamma_tilde_i;
  ChMatrix33<double> Gammai;
  ChMatrix33<double> Ri;
  ChMatrix33<double> DRot_I_phi_tilde_n_MT_T_overline [4];
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_260;
  MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *local_258;
  ChVector<double> local_250;
  ChMatrix33<double> *local_238;
  ChMatrix33<double> *pCStack_230;
  ChMatrix33<double> *local_228;
  ChMatrix33<double> local_1e8;
  ChMatrix33<double> local_1a0;
  ChMatrix33<double> local_158 [4];
  
  this_00 = this->phi_tilde_n;
  pCVar1 = &this->T_overline;
  lVar6 = 0;
  pCVar4 = this_00;
  do {
    rotutils::DRot_I(&local_1a0,pCVar4);
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&local_1a0;
    local_1e8.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)pCVar1;
    ChMatrix33<double>::operator=
              ((ChMatrix33<double> *)
               ((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + lVar6),
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
                *)&local_1e8);
    lVar6 = lVar6 + 0x48;
    pCVar4 = pCVar4 + 1;
  } while (lVar6 != 0x120);
  paCVar3 = this->Phi_Delta_i;
  lVar6 = 0;
  pCVar2 = this->iTa_i;
  do {
    Interp((ChVector<double> *)&local_238,(fea *)this_00,(ChVector<double> *)pCVar2,(double *)&xi_i)
    ;
    pCVar4 = this->phi_tilde_i + lVar6;
    pCVar4->m_data[0] = (double)local_238;
    pCVar4->m_data[1] = (double)pCStack_230;
    pCVar4->m_data[2] = (double)local_228;
    rotutils::RotAndDRot(pCVar4,&local_1a0,&local_1e8);
    local_228 = this->iTa_i + lVar6;
    xi = &local_1a0;
    local_238 = pCVar1;
    pCStack_230 = xi;
    ChMatrix33<double>::operator=
              (this->T_i + lVar6,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_238);
    local_250.m_data[1] = (double)&local_1e8;
    local_250.m_data[0] = (double)pCVar1;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((ChMatrix33<double> *)&local_238,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_250);
    lVar5 = 0;
    do {
      local_250.m_data[1] =
           (double)((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + lVar5);
      local_250.m_data[0] = (double)&local_238;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)
                 ((long)(*paCVar3)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar5),
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_250);
      lVar5 = lVar5 + 0x48;
    } while (lVar5 != 0x120);
    lVar6 = lVar6 + 1;
    paCVar3 = paCVar3 + 1;
    pCVar2 = v;
  } while (lVar6 != 4);
  Interp(&local_250,(fea *)this_00,(ChVector<double> *)v,(double *)xi);
  rotutils::Rot((ChMatrix33<double> *)&local_238,&local_250);
  local_260 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
               *)pCVar1;
  local_258 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
               *)&local_238;
  ChMatrix33<double>::operator=
            (&this->T_0,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_260);
  paCVar3 = this->Phi_Delta_A;
  lVar6 = 0;
  pCVar2 = this->iTa_A;
  do {
    Interp((ChVector<double> *)&local_238,(fea *)this_00,(ChVector<double> *)pCVar2,(double *)&xi_A)
    ;
    pCVar4 = this->phi_tilde_A + lVar6;
    pCVar4->m_data[0] = (double)local_238;
    pCVar4->m_data[1] = (double)pCStack_230;
    pCVar4->m_data[2] = (double)local_228;
    rotutils::RotAndDRot(pCVar4,&local_1a0,&local_1e8);
    local_228 = this->iTa_A + lVar6;
    local_238 = pCVar1;
    pCStack_230 = &local_1a0;
    ChMatrix33<double>::operator=
              (this->T_A + lVar6,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_238);
    local_258 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                 *)&local_1e8;
    local_260 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                 *)pCVar1;
    ChMatrix33<double>::
    ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((ChMatrix33<double> *)&local_238,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_260);
    lVar5 = 0;
    do {
      local_258 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                   *)((long)local_158[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + lVar5);
      local_260 = (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                   *)&local_238;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)
                 ((long)(*paCVar3)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                        m_data.array + lVar5),
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_260);
      lVar5 = lVar5 + 0x48;
    } while (lVar5 != 0x120);
    lVar6 = lVar6 + 1;
    paCVar3 = paCVar3 + 1;
    pCVar2 = extraout_RDX;
  } while (lVar6 != 4);
  return;
}

Assistant:

void ChElementShellReissner4::InterpolateOrientation() {
    ChMatrix33<> DRot_I_phi_tilde_n_MT_T_overline[NUMNODES];
    ChMatrix33<> Ri, Gammai;
    for (int n = 0; n < NUMNODES; n++) {
        ChMatrix33<> mDrot_I = rotutils::DRot_I(phi_tilde_n[n]);
#ifdef CHSIMPLIFY_DROT
        mDrot_I = ChMatrix33<>(1);
#endif
        DRot_I_phi_tilde_n_MT_T_overline[n] = mDrot_I * T_overline.transpose();
    }
    for (int i = 0; i < NUMIP; i++) {
        phi_tilde_i[i] = Interp(phi_tilde_n, xi_i[i]);
        rotutils::RotAndDRot(phi_tilde_i[i], Ri, Gammai);
#ifdef CHSIMPLIFY_DROT
        Gammai = ChMatrix33<>(1);
#endif
        T_i[i] = T_overline * Ri * iTa_i[i];
        ChMatrix33<> T_overline_Gamma_tilde_i(T_overline * Gammai);
        for (int n = 0; n < NUMNODES; n++) {
            Phi_Delta_i[i][n] = T_overline_Gamma_tilde_i * DRot_I_phi_tilde_n_MT_T_overline[n];
        }
    }
    ChVector<> phi_tilde_0 = Interp(phi_tilde_n, xi_0);
    T_0 = T_overline * rotutils::Rot(phi_tilde_0);
    for (int i = 0; i < NUMSSEP; i++) {
        phi_tilde_A[i] = Interp(phi_tilde_n, xi_A[i]);
        rotutils::RotAndDRot(phi_tilde_A[i], Ri, Gammai);
#ifdef CHSIMPLIFY_DROT
        Gammai = ChMatrix33<>(1);
#endif
        T_A[i] = T_overline * Ri * iTa_A[i];
        ChMatrix33<> T_overline_Gamma_tilde_A(T_overline * Gammai);
        for (int n = 0; n < NUMNODES; n++) {
            Phi_Delta_A[i][n] = T_overline_Gamma_tilde_A * DRot_I_phi_tilde_n_MT_T_overline[n];
        }
    }
}